

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::Assignment::Assignment
          (Assignment *this,CodeLocation *l,pool_ptr<soul::heart::Expression> *dest)

{
  CodeLocation local_30;
  pool_ptr<soul::heart::Expression> *local_20;
  pool_ptr<soul::heart::Expression> *dest_local;
  CodeLocation *l_local;
  Assignment *this_local;
  
  local_20 = dest;
  dest_local = (pool_ptr<soul::heart::Expression> *)l;
  l_local = (CodeLocation *)this;
  CodeLocation::CodeLocation(&local_30,l);
  Statement::Statement(&this->super_Statement,&local_30);
  CodeLocation::~CodeLocation(&local_30);
  (this->super_Statement).super_Object._vptr_Object = (_func_int **)&PTR__Assignment_00641080;
  (this->target).object = dest->object;
  return;
}

Assistant:

Assignment (CodeLocation l, pool_ptr<Expression> dest)  : Statement (std::move (l)), target (dest)  {}